

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void toktlini(errcxdef *errctx,toktldef *toktab,uchar *mem,uint siz)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  
  memset(in_RSI,0,0x48);
  *in_RSI = toktladd;
  in_RSI[1] = toktlsea;
  in_RSI[3] = toktleach;
  in_RSI[2] = toktlset;
  in_RSI[5] = in_RDI;
  in_RSI[6] = in_RDX;
  in_RSI[7] = in_RDX;
  *(undefined4 *)((long)in_RSI + 0x44) = in_ECX;
  return;
}

Assistant:

void toktlini(errcxdef *errctx, toktldef *toktab, uchar *mem, uint siz)
{
    CLRSTRUCT(*toktab);
    
    /* initialize superclass data */
    toktab->toktlsc.toktfadd = toktladd;           /* set add-symbol method */
    toktab->toktlsc.toktfsea = toktlsea;         /* set search-table method */
    toktab->toktlsc.toktfeach = toktleach;             /* set 'each' method */
    toktab->toktlsc.toktfset = toktlset;             /* set 'update' method */
    toktab->toktlsc.tokterr = errctx;         /* set error handling context */
    
    /* initialize class data */
    toktab->toktlptr = mem;
    toktab->toktlnxt = mem;
    toktab->toktlsiz = siz;
}